

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc8.cpp
# Opt level: O2

void __thiscall Crc8::DisplayTable(Crc8 *this)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  
  for (iVar2 = 0; iVar2 != 0x10; iVar2 = iVar2 + 1) {
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"0x");
      lVar1 = *(long *)poVar3;
      *(uint *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x18) | 0x4000;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffffb5 | 8;
      poVar3 = std::operator<<(poVar3,0x30);
      *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)*(byte *)((long)this + lVar4));
      std::operator<<(poVar3,", ");
    }
    std::operator<<((ostream *)&std::cout,"\n");
    this = (Crc8 *)((long)this + 0x10);
  }
  return;
}

Assistant:

void Crc8::DisplayTable() const
{
  int index = 0;

  for (int i = 0; i < 16; ++i)
  {
    for (int j = 0; j < 16; ++j)
    {
      std::cout << "0x" << std::uppercase << std::hex << std::setfill('0') << std::setw(2) << int(crcTable[index++]) << ", ";
    }

    std::cout << "\n";
  }
}